

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Bac_ManWriteBlif(char *pFileName,Bac_Man_t *p)

{
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  pvVar1 = p->pMioLib;
  if (pvVar1 != (void *)0x0) {
    pvVar3 = Abc_FrameReadLibGen();
    if (pvVar1 != pvVar3) {
      puts("Genlib library used in the mapped design is not longer a current library.");
      return;
    }
  }
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    pcVar2 = p->pName;
    pcVar4 = Extra_TimeStamp();
    fprintf(__stream,"# Design \"%s\" written via CBA package in ABC on %s\n\n",pcVar2,pcVar4);
    Bac_ManAssignInternWordNames(p);
    lVar5 = 0xd0;
    for (lVar6 = 1; lVar6 <= p->nNtks; lVar6 = lVar6 + 1) {
      Bac_ManWriteBlifNtk((FILE *)__stream,(Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar5));
      lVar5 = lVar5 + 0xd0;
    }
    fclose(__stream);
    return;
  }
  printf("Cannot open output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Bac_ManWriteBlif( char * pFileName, Bac_Man_t * p )
{
    FILE * pFile;
    Bac_Ntk_t * pNtk; 
    int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "# Design \"%s\" written via CBA package in ABC on %s\n\n", Bac_ManName(p), Extra_TimeStamp() );
    Bac_ManAssignInternWordNames( p );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManWriteBlifNtk( pFile, pNtk );
    fclose( pFile );
}